

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall MyAudioDescriptor::FillDescriptor(MyAudioDescriptor *this,MXFReader *Reader)

{
  bool bVar1;
  Dictionary *pDVar2;
  byte_t *pbVar3;
  WaveAudioDescriptor *pWVar4;
  unsigned_long_long *puVar5;
  long *plVar6;
  reference ppIVar7;
  char *pcVar8;
  ILogSink *pIVar9;
  reference ppIVar10;
  value_type local_2d8;
  Result_t local_260 [104];
  char local_1f8 [8];
  char buf [64];
  value_type local_1b0;
  MCALabelSubDescriptor *p;
  _Self local_1a0;
  iterator i;
  Result_t local_130 [104];
  Result_t local_c8 [104];
  undefined1 local_60 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  UL local_38;
  MXFReader *local_18;
  MXFReader *Reader_local;
  MyAudioDescriptor *this_local;
  
  local_18 = Reader;
  Reader_local = (MXFReader *)this;
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_WaveAudioDescriptor);
  ASDCP::UL::UL(&local_38,pbVar3);
  pWVar4 = get_descriptor_by_type<AS_02::PCM::MXFReader,ASDCP::MXF::WaveAudioDescriptor>
                     (Reader,&local_38);
  this->m_WaveAudioDescriptor = pWVar4;
  ASDCP::UL::~UL(&local_38);
  if (this->m_WaveAudioDescriptor == (WaveAudioDescriptor *)0x0) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"Audio descriptor not found.\n");
  }
  else {
    (this->super_AudioDescriptor).AudioSamplingRate =
         *(Rational *)(this->m_WaveAudioDescriptor + 0xf0);
    bVar1 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                      ((optional_property<unsigned_long_long> *)(this->m_WaveAudioDescriptor + 0xf8)
                      );
    if (!bVar1) {
      puVar5 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(this->m_WaveAudioDescriptor + 0xf8));
      (this->super_AudioDescriptor).ContainerDuration = (ui32_t)*puVar5;
    }
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_AudioChannelLabelSubDescriptor);
  (**(code **)(*plVar6 + 0xb0))(local_c8,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t(local_c8);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_SoundfieldGroupLabelSubDescriptor);
  (**(code **)(*plVar6 + 0xb0))(local_130,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t(local_130);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_GroupOfSoundfieldGroupsLabelSubDescriptor);
  (**(code **)(*plVar6 + 0xb0))(&i,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t((Result_t *)&i);
  local_1a0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
       begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  while( true ) {
    p = (MCALabelSubDescriptor *)
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::end
                  ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                    *)local_60);
    bVar1 = std::operator!=(&local_1a0,(_Self *)&p);
    if (!bVar1) break;
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_1a0);
    if (*ppIVar7 == (InterchangeObject *)0x0) {
      local_2d8 = (value_type)0x0;
    }
    else {
      local_2d8 = (value_type)
                  __dynamic_cast(*ppIVar7,&ASDCP::MXF::InterchangeObject::typeinfo,
                                 &ASDCP::MXF::MCALabelSubDescriptor::typeinfo,0);
    }
    local_1b0 = local_2d8;
    if (local_2d8 == (value_type)0x0) {
      pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
      ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_1a0);
      pcVar8 = Kumu::UUID::EncodeHex((UUID *)(*ppIVar7 + 0x58),local_1f8,0x40);
      Kumu::ILogSink::Error(pIVar9,"Audio sub-descriptor type error.\n",pcVar8);
    }
    else {
      std::__cxx11::
      list<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
      ::push_back(&this->m_ChannelDescriptorList,&local_1b0);
    }
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_1a0);
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::clear
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  plVar6 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar2 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar3 = ASDCP::Dictionary::ul(pDVar2,MDD_Track);
  (**(code **)(*plVar6 + 0xb0))(local_260,plVar6,pbVar3,local_60);
  Kumu::Result_t::~Result_t(local_260);
  bVar1 = std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 *)local_60);
  if (bVar1) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"MXF Metadata contains no Track Sets.\n");
  }
  ppIVar10 = std::__cxx11::
             list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
             ::front((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)local_60);
  (this->super_AudioDescriptor).EditRate = *(Rational *)(*ppIVar10 + 0x108);
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_60);
  return;
}

Assistant:

void FillDescriptor(AS_02::PCM::MXFReader& Reader)
  {
    m_WaveAudioDescriptor = get_descriptor_by_type<AS_02::PCM::MXFReader, WaveAudioDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_WaveAudioDescriptor));

    if ( m_WaveAudioDescriptor != 0 )
      {
	AudioSamplingRate = m_WaveAudioDescriptor->SampleRate;
        if ( ! m_WaveAudioDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_WaveAudioDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Audio descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_AudioChannelLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SoundfieldGroupLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
	MCALabelSubDescriptor *p = dynamic_cast<MCALabelSubDescriptor*>(*i);

	if ( p )
	  {
	    m_ChannelDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("Audio sub-descriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);
    
    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }